

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::Psbt::SetTxOutRecord(Psbt *this,uint32_t index,ByteData *key,ByteData *value)

{
  void *pvVar1;
  bool bVar2;
  byte bVar3;
  CfdException *pCVar4;
  undefined4 in_register_00000034;
  long lVar5;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  int local_7c;
  undefined1 local_78 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xbc6,"SetTxOutRecord");
  pvVar1 = this->wally_psbt_pointer_;
  bVar2 = ByteData::IsEmpty(key);
  if (bVar2) {
    local_78._0_8_ = "cfdcore_psbt.cpp";
    local_78._8_4_ = 0xbca;
    local_78._16_8_ = "SetTxOutRecord";
    logger::log<>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"psbt empty key error.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._0_8_ = local_78 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"psbt empty key error.","")
    ;
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_40,key);
  ByteData::GetBytes(&local_58,value);
  lVar5 = (ulong)index * 0xd0;
  bVar3 = SetPsbtOutput(&local_40,&local_58,
                        (wally_psbt_output *)(*(long *)((long)pvVar1 + 0x28) + lVar5));
  if (1 < bVar3) {
    if (bVar3 == 2) {
      lVar5 = *(long *)((long)pvVar1 + 0x28) + lVar5 + 0x20;
    }
    else {
      lVar5 = *(long *)((long)pvVar1 + 0x28) + lVar5 + 0x38;
    }
    local_7c = wally_map_sort(lVar5,0);
    if (local_7c != 0) {
      local_78._0_8_ = "cfdcore_psbt.cpp";
      local_78._8_4_ = 0xbe3;
      local_78._16_8_ = "SetTxOutRecord";
      logger::log<int&>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                        &local_7c);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._0_8_ = local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"psbt output sort unknowns error.","");
      CfdException::CfdException(pCVar4,kCfdInternalError,(string *)local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::SetTxOutRecord(
    uint32_t index, const ByteData &key, const ByteData &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }

  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();
  uint8_t type =
      SetPsbtOutput(key_vec, val_vec, &psbt_pointer->outputs[index]);

  struct wally_map *map_ptr = nullptr;
  switch (type) {
    case kPsbtOutputRedeemScript:
      // fall-through
    case kPsbtOutputWitnessScript:
      break;
    case kPsbtOutputBip32Derivation:
      map_ptr = &psbt_pointer->outputs[index].keypaths;
      break;
    default:
      map_ptr = &psbt_pointer->outputs[index].unknowns;
      break;
  }
  if (map_ptr != nullptr) {
    int ret = wally_map_sort(map_ptr, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(
          kCfdInternalError, "psbt output sort unknowns error.");
    }
  }
}